

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmem.c
# Opt level: O0

gpointer g_try_malloc(gsize n_bytes)

{
  undefined8 local_18;
  gpointer mem;
  gsize n_bytes_local;
  
  if (n_bytes == 0) {
    local_18 = (void *)0x0;
  }
  else {
    local_18 = malloc(n_bytes);
  }
  return local_18;
}

Assistant:

gpointer g_try_malloc (gsize n_bytes)
{
    gpointer mem;

    if (n_bytes)
        mem = malloc (n_bytes);
    else
        mem = NULL;

    return mem;
}